

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

Expression *
slang::ast::ArbitrarySymbolExpression::fromSyntax
          (Compilation *comp,NameSyntax *syntax,ASTContext *context,
          bitmask<slang::ast::LookupFlags> extraLookupFlags)

{
  LookupResult *result_00;
  Symbol *args_1;
  Type *args_3;
  size_t in_RDX;
  Compilation *in_RDI;
  LookupResult *in_stack_00000080;
  ASTContext *in_stack_00000088;
  NameSyntax *in_stack_00000090;
  HierarchicalReference hierRef;
  Symbol *symbol;
  LookupResult result;
  undefined4 in_stack_fffffffffffffca8;
  LookupFlags in_stack_fffffffffffffcac;
  Compilation *in_stack_fffffffffffffcb0;
  undefined1 isLValue;
  Symbol *in_stack_fffffffffffffcb8;
  Compilation *in_stack_fffffffffffffcc0;
  SyntaxNode *args_4;
  Compilation *args_2;
  Compilation *compilation;
  undefined1 local_298 [40];
  underlying_type local_270;
  underlying_type local_26c;
  SyntaxNode *local_268;
  size_t local_28;
  Compilation *local_18;
  Compilation *local_8;
  
  local_28 = in_RDX;
  local_18 = in_RDI;
  LookupResult::LookupResult((LookupResult *)in_stack_fffffffffffffcb0);
  local_270 = (underlying_type)
              ast::operator|((LookupFlags)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
  local_26c = (underlying_type)
              bitmask<slang::ast::LookupFlags>::operator|
                        ((bitmask<slang::ast::LookupFlags> *)in_stack_fffffffffffffcb8,
                         (bitmask<slang::ast::LookupFlags> *)in_stack_fffffffffffffcb0);
  Lookup::name(in_stack_00000090,in_stack_00000088,hierRef.target._4_4_,in_stack_00000080);
  LookupResult::reportDiags
            ((LookupResult *)in_stack_fffffffffffffcb0,
             (ASTContext *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  local_298._16_8_ = local_268;
  if (local_268 == (SyntaxNode *)0x0) {
    local_8 = (Compilation *)
              Expression::badExpr(in_stack_fffffffffffffcb0,
                                  (Expression *)
                                  CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  }
  else {
    result_00 = (LookupResult *)(local_28 + 0x10);
    compilation = (Compilation *)local_298;
    bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)compilation,LValue);
    isLValue = (undefined1)((ulong)in_stack_fffffffffffffcb0 >> 0x38);
    bitmask<slang::ast::ASTFlags>::has
              ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffcc0,
               (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffcb8);
    Compilation::noteReference(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,(bool)isLValue);
    HierarchicalReference::fromLookup(compilation,result_00);
    args_2 = local_18;
    args_1 = (Symbol *)
             not_null<const_slang::ast::Scope_*>::operator*
                       ((not_null<const_slang::ast::Scope_*> *)0xa01bec);
    args_4 = (SyntaxNode *)local_298._16_8_;
    args_3 = Compilation::getVoidType(local_18);
    slang::syntax::SyntaxNode::sourceRange(local_268);
    in_stack_fffffffffffffcb0 =
         (Compilation *)
         BumpAllocator::
         emplace<slang::ast::ArbitrarySymbolExpression,slang::ast::Scope_const&,slang::ast::Symbol_const&,slang::ast::Type_const&,slang::ast::HierarchicalReference*,slang::SourceRange>
                   (&compilation->super_BumpAllocator,(Scope *)result_00,args_1,(Type *)args_2,
                    (HierarchicalReference **)args_3,(SourceRange *)args_4);
    local_8 = in_stack_fffffffffffffcb0;
  }
  local_298._12_4_ = 1;
  LookupResult::~LookupResult((LookupResult *)in_stack_fffffffffffffcb0);
  return (Expression *)local_8;
}

Assistant:

Expression& ArbitrarySymbolExpression::fromSyntax(Compilation& comp, const NameSyntax& syntax,
                                                  const ASTContext& context,
                                                  bitmask<LookupFlags> extraLookupFlags) {
    LookupResult result;
    Lookup::name(syntax, context,
                 LookupFlags::ForceHierarchical | LookupFlags::NoSelectors | extraLookupFlags,
                 result);
    result.reportDiags(context);

    const Symbol* symbol = result.found;
    if (!symbol)
        return badExpr(comp, nullptr);

    comp.noteReference(*symbol, context.flags.has(ASTFlags::LValue));

    auto hierRef = HierarchicalReference::fromLookup(comp, result);
    return *comp.emplace<ArbitrarySymbolExpression>(*context.scope, *symbol, comp.getVoidType(),
                                                    &hierRef, syntax.sourceRange());
}